

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Matchers::Impl::StdString::Contains::~Contains(Contains *this)

{
  Contains *this_local;
  
  ~Contains(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

Matchers::Impl::StdString::Contains::~Contains() {}